

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

int compile(Vm *vm)

{
  int iVar1;
  
  (vm->compiler).print_expr = true;
  vm->current_status = VM_STATUS_COMPILING;
  if ((vm->compiler).scope[0].size == 0) {
    declare_natives(vm);
  }
  iVar1 = _setjmp((__jmp_buf_tag *)error_buf);
  if (iVar1 == 0) {
    do {
      stmt(vm);
    } while ((vm->compiler).token.type != TOKEN_EOF);
    emit_no_arg(vm,OP_RETURN);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int compile(Vm *vm) {
    vm->compiler.print_expr = true;
    vm->current_status = VM_STATUS_COMPILING;

    if (vm->compiler.scope[0].size <= 0) {
        declare_natives(vm);
    }

    int val = setjmp(error_buf);
    if (val) {
        return val;
    }

    do {
        stmt(vm);
    } while (vm->compiler.token.type != TOKEN_EOF);

    emit_no_arg(vm, OP_RETURN);

    return 0;

}